

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O2

Gia_Man_t * Jf_ManDeriveGia(Jf_Man_t *p)

{
  uint *pCut;
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Man_t *p_03;
  char *pcVar5;
  Vec_Int_t *pVVar6;
  Gia_Obj_t *pGVar7;
  int *piVar8;
  word *pIn;
  Gia_Man_t *pGVar9;
  int iVar10;
  word *local_80;
  word uTruth;
  word Truth [4];
  
  p_00 = Vec_IntStartFull(p->pGia->nObjs);
  p_01 = Vec_IntAlloc(0x10000);
  p_02 = Vec_IntAlloc(0x10);
  iVar10 = p->pPars->nLutSize;
  iVar4 = 1 << ((char)iVar10 - 6U & 0x1f);
  if (iVar10 < 7) {
    iVar4 = 1;
  }
  uTruth = 0;
  p_03 = Gia_ManStart(p->pGia->nObjs);
  pcVar5 = Abc_UtilStrsav(p->pGia->pName);
  p_03->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pGia->pSpec);
  p_03->pSpec = pcVar5;
  pVVar6 = Vec_IntStart((p->pGia->nObjs * 6) / 5 + 100);
  p_03->vLevels = pVVar6;
  iVar10 = 0;
  Vec_IntWriteEntry(p_00,0,0);
  while ((iVar10 < p->pGia->vCis->nSize &&
         (pGVar7 = Gia_ManCi(p->pGia,iVar10), pGVar7 != (Gia_Obj_t *)0x0))) {
    iVar1 = Gia_ObjId(p->pGia,pGVar7);
    iVar2 = Gia_ManAppendCi(p_03);
    Vec_IntWriteEntry(p_00,iVar1,iVar2);
    iVar10 = iVar10 + 1;
  }
  if (p->pPars->fCutMin == 0) {
    Gia_ObjComputeTruthTableStart(p->pGia,p->pPars->nLutSize);
  }
  Gia_ManHashStart(p_03);
  local_80 = &uTruth;
  iVar10 = 0;
  do {
    if ((p->pGia->nObjs <= iVar10) ||
       (pGVar7 = Gia_ManObj(p->pGia,iVar10), pGVar7 == (Gia_Obj_t *)0x0)) {
      iVar10 = 0;
      while ((iVar10 < p->pGia->vCos->nSize &&
             (pGVar7 = Gia_ManCo(p->pGia,iVar10), pGVar7 != (Gia_Obj_t *)0x0))) {
        iVar4 = Gia_ObjFaninId0p(p->pGia,pGVar7);
        iVar4 = Vec_IntEntry(p_00,iVar4);
        iVar4 = Abc_LitNotCond(iVar4,*(uint *)pGVar7 >> 0x1d & 1);
        Gia_ManAppendCo(p_03,iVar4);
        iVar10 = iVar10 + 1;
      }
      if (p->pPars->fCutMin == 0) {
        Gia_ObjComputeTruthTableStop(p->pGia);
      }
      Vec_IntFree(p_00);
      Vec_IntFree(p_02);
      Vec_IntFree(p_01);
      Gia_ManHashStop(p_03);
      Gia_ManSetRegNum(p_03,p->pGia->nRegs);
      pGVar9 = p_03;
      if (p->pPars->fCutMin == 0) {
        pGVar9 = Gia_ManCleanup(p_03);
        Gia_ManStop(p_03);
      }
      return pGVar9;
    }
    if (((~*(uint *)pGVar7 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar7) &&
       ((iVar1 = Gia_ObjIsBuf(pGVar7), iVar1 == 0 &&
        (iVar1 = Gia_ObjRefNum(p->pGia,pGVar7), iVar1 != 0)))) {
      piVar8 = Jf_ObjCuts(p,iVar10);
      pCut = (uint *)(piVar8 + 1);
      if (p->pPars->fCutMin == 0) {
        p_02->nSize = 0;
        uVar3 = 1;
        while ((uVar3 <= (*pCut & 0xf) && (iVar1 = Jf_CutLit((int *)pCut,uVar3), iVar1 != 0))) {
          iVar1 = Abc_Lit2Var(iVar1);
          Vec_IntPush(p_02,iVar1);
          uVar3 = uVar3 + 1;
        }
        local_80 = Gia_ObjComputeTruthTableCut(p->pGia,pGVar7,p_02);
LAB_005e7c54:
        p_02->nSize = 0;
        uVar3 = 1;
        while ((uVar3 <= (*pCut & 0xf) && (iVar1 = Jf_CutLit((int *)pCut,uVar3), iVar1 != 0))) {
          iVar1 = Abc_Lit2LitL(p_00->pArray,iVar1);
          Vec_IntPush(p_02,iVar1);
          uVar3 = uVar3 + 1;
        }
        iVar1 = Dsm_ManTruthToGia(p_03,local_80,p_02,p_01);
        if (p->pPars->fCutMin == 0) {
          iVar2 = 0;
        }
        else {
          iVar2 = Jf_CutFuncCompl((int *)pCut);
        }
        uVar3 = Abc_LitNotCond(iVar1,iVar2);
      }
      else {
        iVar1 = Jf_CutFuncClass((int *)pCut);
        uVar3 = *pCut & 0xf;
        if (uVar3 == 1) {
          if (iVar1 != 1) {
            __assert_fail("Class == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                          ,0x655,"Gia_Man_t *Jf_ManDeriveGia(Jf_Man_t *)");
          }
          iVar1 = piVar8[2];
          iVar2 = Jf_CutFuncCompl((int *)pCut);
          iVar1 = Abc_LitNotCond(iVar1,iVar2);
          uVar3 = Abc_Lit2LitL(p_00->pArray,iVar1);
        }
        else {
          if (uVar3 != 0) {
            if (p->pPars->fFuncDsd == 0) {
              pIn = Vec_MemReadEntry(p->vTtMem,iVar1);
              Abc_TtCopy(Truth,pIn,iVar4,0);
              local_80 = Truth;
            }
            else {
              uTruth = Sdm_ManReadDsdTruth(p->pDsd,iVar1);
            }
            if ((p->pDsd != (Sdm_Man_t *)0x0) &&
               (uVar3 = Sdm_ManReadDsdVarNum(p->pDsd,iVar1), uVar3 != (*pCut & 0xf))) {
              __assert_fail("p->pDsd == NULL || Sdm_ManReadDsdVarNum(p->pDsd, Class) == Jf_CutSize(pCut)"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                            ,0x65f,"Gia_Man_t *Jf_ManDeriveGia(Jf_Man_t *)");
            }
            goto LAB_005e7c54;
          }
          if (iVar1 != 0) {
            __assert_fail("Class == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                          ,0x64f,"Gia_Man_t *Jf_ManDeriveGia(Jf_Man_t *)");
          }
          uVar3 = *pCut >> 8;
        }
      }
      Vec_IntWriteEntry(p_00,iVar10,uVar3);
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Jf_ManDeriveGia( Jf_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    int i, k, iLit, Class, * pCut;
    int nWords = Abc_Truth6WordNum(p->pPars->nLutSize);
    word uTruth = 0, * pTruth = &uTruth, Truth[JF_WORD_MAX];
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    pNew->vLevels = Vec_IntStart( 6*Gia_ManObjNum(p->pGia)/5 + 100 );
    // map primary inputs
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachCi( p->pGia, pObj, i )
        Vec_IntWriteEntry( vCopies, Gia_ObjId(p->pGia, pObj), Gia_ManAppendCi(pNew) );
    // iterate through nodes used in the mapping
    if ( !p->pPars->fCutMin )
        Gia_ObjComputeTruthTableStart( p->pGia, p->pPars->nLutSize );
    Gia_ManHashStart( pNew );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
       if ( Gia_ObjIsBuf(pObj) || Gia_ObjRefNum(p->pGia, pObj) == 0 )
            continue;
        pCut = Jf_ObjCutBest( p, i );
//        printf( "Best cut of node %d:  ", i );  Jf_CutPrint(pCut);
        // get the truth table
        if ( p->pPars->fCutMin )
        {
            Class = Jf_CutFuncClass( pCut );
            if ( Jf_CutSize(pCut) == 0 )
            {
                assert( Class == 0 );
                Vec_IntWriteEntry( vCopies, i, Jf_CutFunc(pCut) );
                continue;
            }
            if ( Jf_CutSize(pCut) == 1 )
            {
                assert( Class == 1 );
                iLit = Abc_LitNotCond( Jf_CutLit(pCut, 1) , Jf_CutFuncCompl(pCut) );
                iLit = Abc_Lit2LitL( Vec_IntArray(vCopies), iLit );
                Vec_IntWriteEntry( vCopies, i, iLit );
                continue;
            }
            if ( p->pPars->fFuncDsd )
                uTruth = Sdm_ManReadDsdTruth(p->pDsd, Class);
            else
                Abc_TtCopy( (pTruth = Truth), Vec_MemReadEntry(p->vTtMem, Class), nWords, 0 );
            assert( p->pDsd == NULL || Sdm_ManReadDsdVarNum(p->pDsd, Class) == Jf_CutSize(pCut) );
        }
        else
        {
            Vec_IntClear( vLeaves );
            Jf_CutForEachLit( pCut, iLit, k )
                Vec_IntPush( vLeaves, Abc_Lit2Var(iLit) );
            pTruth = Gia_ObjComputeTruthTableCut( p->pGia, pObj, vLeaves );
        }
        // collect incoming literals
        Vec_IntClear( vLeaves );
        Jf_CutForEachLit( pCut, iLit, k )
            Vec_IntPush( vLeaves, Abc_Lit2LitL(Vec_IntArray(vCopies), iLit) );
        // create GIA
        iLit = Dsm_ManTruthToGia( pNew, pTruth, vLeaves, vCover );
        iLit = Abc_LitNotCond( iLit, (p->pPars->fCutMin && Jf_CutFuncCompl(pCut)) );
        Vec_IntWriteEntry( vCopies, i, iLit );
    }
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
        Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
    }
    if ( !p->pPars->fCutMin )
        Gia_ObjComputeTruthTableStop( p->pGia );
    Vec_IntFree( vCopies );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vCover );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
//    Dsm_ManReportStats();
    // perform cleanup
    if ( !p->pPars->fCutMin )
    {
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    return pNew;
}